

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembly.h
# Opt level: O2

void __thiscall Instruction::Instruction(Instruction *this,string *op,string *name1,string *name2)

{
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->op,(string *)op);
  std::__cxx11::string::string((string *)&this->name1,(string *)name1);
  std::__cxx11::string::string((string *)&this->name2,(string *)name2);
  return;
}

Assistant:

Instruction(string op, string name1, string name2): op(op), name1(name1), name2(name2), label()  {}